

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.cpp
# Opt level: O2

file_mapping *
cornelich::util::create_mapping(file_mapping *__return_storage_ptr__,string *path,uint32_t size)

{
  bool bVar1;
  uintmax_t uVar2;
  path pStack_48;
  
  std::__cxx11::string::string((string *)&pStack_48,(string *)path);
  bVar1 = boost::filesystem::exists(&pStack_48);
  std::__cxx11::string::~string((string *)&pStack_48);
  if (!bVar1) {
    touch(path);
  }
  std::__cxx11::string::string((string *)&pStack_48,(string *)path);
  uVar2 = boost::filesystem::file_size(&pStack_48);
  std::__cxx11::string::~string((string *)&pStack_48);
  if (uVar2 < size) {
    std::__cxx11::string::string((string *)&pStack_48,(string *)path);
    boost::filesystem::resize_file(&pStack_48,(ulong)size);
    std::__cxx11::string::~string((string *)&pStack_48);
  }
  boost::interprocess::file_mapping::file_mapping
            (__return_storage_ptr__,(path->_M_dataplus)._M_p,read_write);
  return __return_storage_ptr__;
}

Assistant:

bip::file_mapping create_mapping(const std::string & path, std::uint32_t size)
{
    if(!fs::exists(path))
    {
        touch(path);
    }
    if(fs::file_size(path) < size)
    {
        fs::resize_file(path, size);
    }
    auto mapping = bip::file_mapping(path.c_str(), bip::read_write);
    return mapping;
}